

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::MarshalFrameDisplay(ScriptContext *scriptContext,FrameDisplay *display)

{
  bool bVar1;
  Recycler *pRVar2;
  FrameDisplay *this;
  void *aValue;
  UnscopablesWrapperObject *this_00;
  RecyclableObject *this_01;
  ScriptContext *objectScriptContext;
  Var aRight;
  ScriptContext *wrappedObjectScriptContext;
  RecyclableObject *wrappedObject;
  Var value;
  uint16 i;
  TrackAllocData local_50;
  FrameDisplay *local_28;
  FrameDisplay *newDisplay;
  FrameDisplay *pFStack_18;
  uint16 length;
  FrameDisplay *display_local;
  ScriptContext *scriptContext_local;
  
  pFStack_18 = display;
  display_local = (FrameDisplay *)scriptContext;
  newDisplay._6_2_ = FrameDisplay::GetLength(display);
  pRVar2 = ScriptContext::GetRecycler((ScriptContext *)display_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&FrameDisplay::typeinfo,(ulong)newDisplay._6_2_ << 3,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
             ,0x7f);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  this = (FrameDisplay *)new<Memory::Recycler>(8,pRVar2,0x446fd0,0);
  FrameDisplay::FrameDisplay(this,newDisplay._6_2_,false);
  local_28 = this;
  for (value._6_2_ = 0; value._6_2_ < newDisplay._6_2_; value._6_2_ = value._6_2_ + 1) {
    aValue = FrameDisplay::GetItem(pFStack_18,(uint)value._6_2_);
    bVar1 = VarIs<Js::UnscopablesWrapperObject>(aValue);
    if (bVar1) {
      this_00 = VarTo<Js::UnscopablesWrapperObject>(aValue);
      this_01 = UnscopablesWrapperObject::GetWrappedObject(this_00);
      objectScriptContext = RecyclableObject::GetScriptContext(this_01);
      aRight = MarshalVar((ScriptContext *)display_local,this_01,objectScriptContext);
      wrappedObject =
           (RecyclableObject *)
           Js::JavascriptOperators::ToUnscopablesWrapperObject
                     (aRight,(ScriptContext *)display_local);
    }
    else {
      wrappedObject = (RecyclableObject *)MarshalVar((ScriptContext *)display_local,aValue,false);
    }
    FrameDisplay::SetItem(local_28,(uint)value._6_2_,wrappedObject);
  }
  return local_28;
}

Assistant:

Var CrossSite::MarshalFrameDisplay(ScriptContext* scriptContext, FrameDisplay *display)
    {
        TTD_XSITE_LOG(scriptContext, "MarshalFrameDisplay", nullptr);

        uint16 length = display->GetLength();
        FrameDisplay *newDisplay =
            RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        for (uint16 i = 0; i < length; i++)
        {
            Var value = display->GetItem(i);
            if (Js::VarIs<UnscopablesWrapperObject>(value))
            {
                // Here we are marshalling the wrappedObject and then ReWrapping th object in the new context.
                RecyclableObject* wrappedObject = Js::VarTo<UnscopablesWrapperObject>(value)->GetWrappedObject();
                ScriptContext* wrappedObjectScriptContext = wrappedObject->GetScriptContext();
                value = JavascriptOperators::ToUnscopablesWrapperObject(CrossSite::MarshalVar(scriptContext,
                  wrappedObject, wrappedObjectScriptContext), scriptContext);
            }
            else
            {
                value = CrossSite::MarshalVar(scriptContext, value);
            }
            newDisplay->SetItem(i, value);
        }

        return (Var)newDisplay;
    }